

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_attribute.cpp
# Opt level: O0

adios2_error adios2_attribute_name(char *name,size_t *size,adios2_attribute *attribute)

{
  adios2_error aVar1;
  string *in_stack_00000008;
  adios2_attribute *in_stack_00000010;
  AttributeBase *attributeBase;
  char *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  allocator local_41;
  string local_40 [64];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"for attribute, in call to adios2_attribute_name",&local_41)
  ;
  adios2::helper::CheckForNullptr<adios2_attribute_const>(in_stack_00000010,in_stack_00000008);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  aVar1 = anon_unknown.dwarf_38258::String2CAPI
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(size_t *)0x173b63);
  return aVar1;
}

Assistant:

adios2_error adios2_attribute_name(char *name, size_t *size, const adios2_attribute *attribute)
{
    try
    {
        adios2::helper::CheckForNullptr(attribute,
                                        "for attribute, in call to adios2_attribute_name");

        const adios2::core::AttributeBase *attributeBase =
            reinterpret_cast<const adios2::core::AttributeBase *>(attribute);

        return String2CAPI(attributeBase->m_Name, name, size);
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_attribute_name"));
    }
}